

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

uint32_t __thiscall cppnet::BufferQueue::Read(BufferQueue *this,char *res,uint32_t len)

{
  shared_ptr<cppnet::BufferBlock> *psVar1;
  shared_ptr<cppnet::BufferBlock> *this_00;
  element_type *peVar2;
  int iVar3;
  uint32_t uVar4;
  shared_ptr<cppnet::BufferBlock> buffer_read;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_58;
  List<cppnet::BufferBlock> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar4 = 0;
  if (((len != 0) && (uVar4 = 0, res != (char *)0x0)) && ((this->_buffer_list)._size != 0)) {
    local_48 = &this->_buffer_list;
    psVar1 = &(this->_buffer_list)._head;
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               &psVar1->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
    this_00 = &this->_buffer_write;
    uVar4 = 0;
    do {
      if (local_58._M_ptr == (element_type *)0x0) break;
      iVar3 = (*((local_58._M_ptr)->super_InnerBuffer).super_Buffer._vptr_Buffer[3])
                        (local_58._M_ptr,res + uVar4,(ulong)(len - uVar4));
      uVar4 = uVar4 + iVar3;
      if (len <= uVar4) break;
      peVar2 = (this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      if (local_58._M_ptr == peVar2) {
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,
                   &(peVar2->super_ListSlot<cppnet::BufferBlock>)._next.
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
        peVar2 = local_68._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
        if (peVar2 == (element_type *)0x0) {
          (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])();
          break;
        }
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_68,
                   &(((this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr)->super_ListSlot<cppnet::BufferBlock>)._next.
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&this_00->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>,
                   &local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      }
      List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)&stack0xffffffffffffffc0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,
                 &psVar1->super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_58,&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      iVar3 = (*((local_58._M_ptr)->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
    } while (iVar3 != 0);
    this->_can_read_length = this->_can_read_length - uVar4;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  }
  return uVar4;
}

Assistant:

uint32_t BufferQueue::Read(char* res, uint32_t len) {
    if (_buffer_list.Size() == 0 || !res || len == 0) {
        return 0;
    }

    auto buffer_read = _buffer_list.GetHead();
    uint32_t total_read_len = 0;
    while (buffer_read) {
        total_read_len += buffer_read->Read(res + total_read_len, len - total_read_len);
        if (total_read_len >= len) {
            break;
        }
        if (buffer_read == _buffer_write) {
            if (_buffer_write->GetNext()) {
                _buffer_write = _buffer_write->GetNext();

            } else {
                Reset();
                break;
            }
        }
        _buffer_list.PopFront();
        buffer_read = _buffer_list.GetHead();
        if (buffer_read->GetCanReadLength() == 0) {
            break;
        }
    }
    _can_read_length -= total_read_len;
    return total_read_len;
}